

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# offline-ekf-flexibility-estimation.hxx
# Opt level: O0

IndexedVectorArray *
stateObservation::examples::offlineEKFFlexibilityEstimation
          (IndexedVectorArray *__return_storage_ptr__,IndexedVectorArray *y,IndexedVectorArray *u,
          Vector *xh0,uint numberOfContacts,
          vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          *contactsPositions,double dt,IndexedVectorArray *ino,IndexedVectorArray *premea)

{
  undefined8 uVar1;
  uint uVar2;
  const_reference other;
  TimeIndex TVar3;
  Matrix<double,__1,_1,_0,__1,_1> *v;
  Matrix<double,__1,_1,_0,__1,_1> local_760;
  Matrix<double,__1,_1,_0,__1,_1> local_750;
  undefined1 local_740 [16];
  undefined1 local_730 [24];
  TimeIndex i_1;
  Matrix<double,__1,__1,_0,__1,__1> local_710;
  Matrix<double,_3,_1,_0,_3,_1> local_6f8;
  uint local_6dc;
  undefined1 local_6d8 [4];
  uint i;
  double local_6a0;
  MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>>
  local_693 [3];
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  local_690;
  Type local_670;
  double local_638;
  MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>>
  local_62b [3];
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  local_628;
  double local_608;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_600;
  undefined1 local_5d8 [8];
  Matrix Q;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_5b8;
  undefined1 local_580 [8];
  Matrix R;
  FixedContactEKFFlexEstimatorIMU estimator;
  double dt_local;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  *contactsPositions_local;
  uint numberOfContacts_local;
  Vector *xh0_local;
  IndexedVectorArray *u_local;
  IndexedVectorArray *y_local;
  IndexedVectorArray *xh;
  
  stateObservation::flexibilityEstimation::FixedContactEKFFlexEstimatorIMU::
  FixedContactEKFFlexEstimatorIMU
            ((FixedContactEKFFlexEstimatorIMU *)
             &R.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols,
             0.005);
  stateObservation::flexibilityEstimation::EKFFlexibilityEstimatorBase::getEKF();
  stateObservation::KalmanFilterBase::getRmatrixIdentity();
  Q.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       0x39b4484bfeebc2a0;
  Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
            (&local_5b8,(MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_580,
             (double *)
             &Q.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::operator=
            ((Matrix<double,_1,_1,0,_1,_1> *)local_580,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
              *)&local_5b8);
  stateObservation::flexibilityEstimation::EKFFlexibilityEstimatorBase::getEKF();
  stateObservation::KalmanFilterBase::getQmatrixIdentity();
  local_608 = 0.0001;
  Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
            (&local_600,(MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_5d8,&local_608);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::operator=
            ((Matrix<double,_1,_1,0,_1,_1> *)local_5d8,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
              *)&local_600);
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Identity();
  local_638 = 1e-08;
  Eigen::
  MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>>
  ::operator*(&local_628,local_62b,&local_638);
  Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<int,int>
            (&local_670,local_5d8,6,6,3,3);
  Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>::operator=
            ((Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false> *)&local_670,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>
              *)&local_628);
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Identity();
  local_6a0 = 1e-08;
  Eigen::
  MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>>
  ::operator*(&local_690,local_693,&local_6a0);
  Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<int,int>
            ((Type *)local_6d8,local_5d8,0xf,0xf,3,3);
  Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>::operator=
            ((Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false> *)local_6d8,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>
              *)&local_690);
  stateObservation::flexibilityEstimation::EKFFlexibilityEstimatorBase::setFlexibilityCovariance
            ((Matrix *)
             &R.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols);
  stateObservation::flexibilityEstimation::FixedContactEKFFlexEstimatorIMU::
  setMeasurementNoiseCovariance
            ((Matrix *)
             &R.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols);
  stateObservation::flexibilityEstimation::FixedContactEKFFlexEstimatorIMU::
  setProcessNoiseCovariance
            ((Matrix *)
             &R.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols);
  stateObservation::flexibilityEstimation::FixedContactEKFFlexEstimatorIMU::setContactsNumber
            ((int)&R + 0x10);
  for (local_6dc = 0; uVar2 = local_6dc, local_6dc < numberOfContacts; local_6dc = local_6dc + 1) {
    other = std::
            vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            ::operator[](contactsPositions,(ulong)local_6dc);
    Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix(&local_6f8,other);
    stateObservation::flexibilityEstimation::FixedContactEKFFlexEstimatorIMU::setContactPosition
              (&R.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols,
               uVar2,&local_6f8);
  }
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<Eigen::Matrix<double,_1,1,0,_1,1>>
            ((Matrix<double,_1,_1,0,_1,_1> *)&local_710,
             (EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)xh0);
  stateObservation::flexibilityEstimation::FixedContactEKFFlexEstimatorIMU::setFlexibilityGuess
            ((Matrix *)
             &R.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_710);
  i_1._7_1_ = 0;
  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::IndexedMatrixArrayT(__return_storage_ptr__);
  TVar3 = IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
          ::getFirstIndex(y);
  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::setValue(__return_storage_ptr__,xh0,TVar3 + -1);
  for (local_730._16_8_ =
            IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
            ::getFirstIndex(y); uVar1 = local_730._16_8_,
      TVar3 = IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
              ::getNextIndex(y), (long)uVar1 < TVar3;
      local_730._16_8_ =
           (long)&(((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_730._16_8_)->
                  m_storage).m_data + 1) {
    IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::operator[]((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)local_730,(TimeIndex)y);
    stateObservation::flexibilityEstimation::FixedContactEKFFlexEstimatorIMU::setMeasurement
              ((Matrix *)
               &R.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols)
    ;
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_730);
    IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::operator[]((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)local_740,(TimeIndex)u);
    stateObservation::flexibilityEstimation::EKFFlexibilityEstimatorBase::setMeasurementInput
              ((Matrix *)
               &R.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols)
    ;
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_740);
    v = (Matrix<double,__1,_1,_0,__1,_1> *)
        stateObservation::flexibilityEstimation::FixedContactEKFFlexEstimatorIMU::
        getFlexibilityVector();
    IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::pushBack(__return_storage_ptr__,v);
    if (ino != (IndexedVectorArray *)0x0) {
      stateObservation::flexibilityEstimation::EKFFlexibilityEstimatorBase::getInnovation();
      IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
      ::setValue(ino,&local_750,local_730._16_8_);
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_750);
    }
    if (premea != (IndexedVectorArray *)0x0) {
      stateObservation::flexibilityEstimation::EKFFlexibilityEstimatorBase::
      getLastPredictedMeasurement();
      IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
      ::setValue(premea,&local_760,local_730._16_8_);
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_760);
    }
  }
  i_1._7_1_ = 1;
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_5d8);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_580);
  stateObservation::flexibilityEstimation::FixedContactEKFFlexEstimatorIMU::
  ~FixedContactEKFFlexEstimatorIMU
            ((FixedContactEKFFlexEstimatorIMU *)
             &R.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols);
  return __return_storage_ptr__;
}

Assistant:

stateObservation::IndexedVectorArray offlineEKFFlexibilityEstimation(
            const stateObservation::IndexedVectorArray & y,
            const stateObservation::IndexedVectorArray & u,
            const Vector & xh0,
            unsigned numberOfContacts,
            const std::vector<Vector3,Eigen::aligned_allocator<Vector3> > & contactsPositions,
            double dt,
            IndexedVectorArray * ino,
            IndexedVectorArray * premea)
{

    (void)dt;
        ///Sizes of the states for the state, the measurement, and the input vector

    flexibilityEstimation::FixedContactEKFFlexEstimatorIMU estimator;


    Matrix R(estimator.getEKF().getRmatrixIdentity());
    R=R*1.e-30;

    Matrix Q(estimator.getEKF().getQmatrixIdentity());
    Q=Q*1.e-4;
    Q.block(6,6,3,3)=Matrix3::Identity()*1.e-8;
    Q.block(15,15,3,3)=Matrix3::Identity()*1.e-8;


    estimator.setFlexibilityCovariance(Q);
    estimator.setMeasurementNoiseCovariance(R);
    estimator.setProcessNoiseCovariance(Q);


    estimator.setContactsNumber(numberOfContacts);

    for (unsigned i = 0; i<numberOfContacts ; ++i)
    {
        estimator.setContactPosition(i,contactsPositions[i]);
    }

    ///
    estimator.setFlexibilityGuess(xh0);

    ///the array of the state estimations over time
    stateObservation::IndexedVectorArray xh;
    xh.setValue(xh0,y.getFirstIndex()-1);

    ///the reconstruction of the state
    for (TimeIndex i=y.getFirstIndex();i<y.getNextIndex();++i)
    {
        //std::cout << i << std::endl;

        ///introduction of the measurement
        estimator.setMeasurement(y[i]);

        estimator.setMeasurementInput(u[i]);

        ///get the estimation and give it to the array
        xh.pushBack(estimator.getFlexibilityVector());

        if (ino != 0)
        {
            ino->setValue(estimator.getInnovation(),i);
        }

        if (premea != 0)
        {
            premea->setValue(estimator.getLastPredictedMeasurement(),i);
        }

    }

    return xh;
}